

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned__int128>
                   (appender out,write_int_arg<unsigned___int128> arg,
                   basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 n_01 [16];
  undefined1 n_02 [16];
  size_t it_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  appender it;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  size_t in_stack_ffffffffffffff50;
  undefined1 auStack_70 [8];
  write_int_data<char> data;
  detail *local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined1 local_31;
  
  pVar1 = specs->type;
  uStack_4b = arg.abs_value._13_3_;
  uStack_50 = arg.abs_value._8_5_;
  data.padding = (size_t)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) == 0) ||
       (value._4_4_ = in_stack_ffffffffffffff4c, value._0_4_ = in_stack_ffffffffffffff48,
       value._8_8_ = in_stack_ffffffffffffff50,
       bVar2 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                         ((detail *)&data.padding,(appender *)(detail *)arg.abs_value,
                          (unsigned___int128)value,arg.abs_value._8_4_,
                          (basic_format_specs<char> *)(ulong)arg.prefix,(locale_ref)specs), !bVar2))
    {
      n_01._4_4_ = in_stack_ffffffffffffff4c;
      n_01._0_4_ = in_stack_ffffffffffffff48;
      n_01._8_8_ = in_stack_ffffffffffffff50;
      iStack_48 = count_digits_fallback<unsigned__int128>
                            ((detail *)arg.abs_value,(unsigned___int128)n_01);
      it_00 = data.padding;
      local_58 = (detail *)arg.abs_value;
      if (specs->precision == -1 && specs->width == 0) {
        if (arg.prefix != 0) {
          for (uVar4 = arg.prefix & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
            buffer<char>::push_back((buffer<char> *)it_00,&stack0xffffffffffffff48);
          }
        }
        data.padding = (size_t)write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/fmt/bundled/format.h:1579:41)>
                               ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits
                               ::operator()((anon_class_32_2_ddb8d65b_for_write_digits *)&local_58,
                                            (reserve_iterator<fmt::v8::appender>)it_00);
      }
      else {
        write_int_data<char>::write_int_data
                  ((write_int_data<char> *)auStack_70,iStack_48,arg.prefix,specs);
        data.padding = (size_t)write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                                         ((appender)it_00,specs,(size_t)auStack_70,
                                          (anon_class_64_3_4ecd7a16 *)&stack0xffffffffffffff48);
      }
    }
    break;
  case oct:
    n_02._4_4_ = in_stack_ffffffffffffff4c;
    n_02._0_4_ = in_stack_ffffffffffffff48;
    n_02._8_8_ = in_stack_ffffffffffffff50;
    iStack_48 = count_digits<3,unsigned__int128>((unsigned___int128)n_02);
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iStack_48)) {
      uVar4 = 0x3000;
      if (arg.prefix == 0) {
        uVar4 = 0x30;
      }
      arg.prefix = (uVar4 | arg.prefix) + 0x1000000;
    }
    local_58 = (detail *)arg.abs_value;
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar4 = arg.prefix & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     &stack0xffffffffffffff48);
        }
      }
      data.padding = (size_t)write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/fmt/bundled/format.h:1612:22)>
                             ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::
                             operator()((anon_class_32_2_ddb8d65b_for_write_digits *)&local_58,
                                        (reserve_iterator<fmt::v8::appender>)
                                        out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_70,iStack_48,arg.prefix,specs);
      data.padding = (size_t)write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                                       (out,specs,(size_t)auStack_70,
                                        (anon_class_64_3_4ecd7a16 *)&stack0xffffffffffffff48);
    }
    break;
  case hex_lower:
  case hex_upper:
    local_31 = pVar1 == hex_upper;
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar3 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar4 = uVar3 << 8;
      if (arg.prefix == 0) {
        uVar4 = uVar3;
      }
      arg.prefix = (uVar4 | arg.prefix) + 0x2000000;
    }
    n_00._4_4_ = in_stack_ffffffffffffff4c;
    n_00._0_4_ = in_stack_ffffffffffffff48;
    n_00._8_8_ = in_stack_ffffffffffffff50;
    iStack_48 = count_digits<4,unsigned__int128>((unsigned___int128)n_00);
    local_58 = (detail *)arg.abs_value;
    bStack_44 = (bool)local_31;
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar4 = arg.prefix & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     &stack0xffffffffffffff48);
        }
      }
      data.padding = (size_t)write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/fmt/bundled/format.h:1590:41)>
                             ::anon_class_64_3_4ecd7a16::anon_class_32_3_bd9b568b_for_write_digits::
                             operator()((anon_class_32_3_bd9b568b_for_write_digits *)&local_58,
                                        (reserve_iterator<fmt::v8::appender>)
                                        out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_70,iStack_48,arg.prefix,specs);
      data.padding = (size_t)write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                                       (out,specs,(size_t)auStack_70,
                                        (anon_class_64_3_4ecd7a16 *)&stack0xffffffffffffff48);
    }
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar3 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar4 = uVar3 << 8;
      if (arg.prefix == 0) {
        uVar4 = uVar3;
      }
      arg.prefix = (uVar4 | arg.prefix) + 0x2000000;
    }
    n._4_4_ = in_stack_ffffffffffffff4c;
    n._0_4_ = in_stack_ffffffffffffff48;
    n._8_8_ = in_stack_ffffffffffffff50;
    iStack_48 = count_digits<1,unsigned__int128>((unsigned___int128)n);
    local_58 = (detail *)arg.abs_value;
    if (specs->precision == -1 && specs->width == 0) {
      if (arg.prefix != 0) {
        for (uVar4 = arg.prefix & 0xffffff; uVar4 != 0; uVar4 = uVar4 >> 8) {
          buffer<char>::push_back
                    ((buffer<char> *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     &stack0xffffffffffffff48);
        }
      }
      data.padding = (size_t)write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zfergus[P]finite-diff/build_O2/_deps/spdlog-src/include/spdlog/fmt/bundled/format.h:1601:22)>
                             ::anon_class_64_3_4ecd7a16::anon_class_32_2_ddb8d65b_for_write_digits::
                             operator()((anon_class_32_2_ddb8d65b_for_write_digits *)&local_58,
                                        (reserve_iterator<fmt::v8::appender>)
                                        out.
                                        super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                        container);
    }
    else {
      write_int_data<char>::write_int_data
                ((write_int_data<char> *)auStack_70,iStack_48,arg.prefix,specs);
      data.padding = (size_t)write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned__int128>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                                       (out,specs,(size_t)auStack_70,
                                        (anon_class_64_3_4ecd7a16 *)&stack0xffffffffffffff48);
    }
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    data.padding = (size_t)write_char<char,fmt::v8::appender>(out,(char)arg.abs_value,specs);
  }
  return (appender)data.padding;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}